

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexeme_Constant.cpp
# Opt level: O0

EncodingPrefix __thiscall psy::C::CharacterConstant::encodingPrefix(CharacterConstant *this)

{
  CharacterConstant *this_local;
  
  if (((this->super_Lexeme).field_0.BD_ >> 6 & 1) == 0) {
    if (((this->super_Lexeme).field_0.BD_ >> 7 & 1) == 0) {
      if (((this->super_Lexeme).field_0.BD_ >> 9 & 1) == 0) {
        this_local._7_1_ = None;
      }
      else {
        this_local._7_1_ = U;
      }
    }
    else {
      this_local._7_1_ = u;
    }
  }
  else {
    this_local._7_1_ = L;
  }
  return this_local._7_1_;
}

Assistant:

CharacterConstant::EncodingPrefix CharacterConstant::encodingPrefix() const
{
    if (F_.L_)
        return EncodingPrefix::L;
    if (F_.u_)
        return EncodingPrefix::u;
    if (F_.U_)
        return EncodingPrefix::U;
    return EncodingPrefix::None;
}